

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvPendulum_dns.c
# Opt level: O2

int check_retval(void *returnvalue,char *funcname,int opt)

{
  if (returnvalue == (void *)0x0 && opt == 0) {
    fprintf(_stderr,"\nERROR: %s() returned NULL pointer\n\n",funcname);
  }
  else {
    if (opt != 1) {
      return 0;
    }
    if (-1 < *returnvalue) {
      return 0;
    }
    fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",funcname);
  }
  return 1;
}

Assistant:

static int check_retval(void* returnvalue, const char* funcname, int opt)
{
  int* retval;

  /* Opt 0: Check if function returned NULL pointer - no memory allocated */
  if (opt == 0 && returnvalue == NULL)
  {
    fprintf(stderr, "\nERROR: %s() returned NULL pointer\n\n", funcname);
    return (1);
  }
  /* Opt 1: Check if retval < 0 */
  else if (opt == 1)
  {
    retval = (int*)returnvalue;
    if (*retval < 0)
    {
      fprintf(stderr, "\nERROR: %s() returned = %d\n\n", funcname, *retval);
      return (1);
    }
  }

  return (0);
}